

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int inputToBuffer(roslz4_stream *str)

{
  void *pvVar1;
  XXH_errorcode XVar2;
  roslz4_stream *in_RDI;
  int ret;
  int to_copy;
  int buffer_left;
  stream_state *state;
  int in_stack_00000054;
  void *in_stack_00000058;
  void *in_stack_00000060;
  int local_4;
  
  pvVar1 = in_RDI->state;
  if ((in_RDI->input_left == 0) || (*(int *)((long)pvVar1 + 0x18) == *(int *)((long)pvVar1 + 0x1c)))
  {
    local_4 = 0;
  }
  else {
    local_4 = min(in_RDI->input_left,*(int *)((long)pvVar1 + 0x18) - *(int *)((long)pvVar1 + 0x1c));
    XVar2 = XXH32_update(in_stack_00000060,in_stack_00000058,in_stack_00000054);
    if (XVar2 == XXH_ERROR) {
      local_4 = -1;
    }
    else {
      memcpy((void *)(*(long *)((long)pvVar1 + 0x10) + (long)*(int *)((long)pvVar1 + 0x1c)),
             in_RDI->input_next,(long)local_4);
      advanceInput(in_RDI,local_4);
      *(int *)((long)pvVar1 + 0x1c) = local_4 + *(int *)((long)pvVar1 + 0x1c);
    }
  }
  return local_4;
}

Assistant:

int inputToBuffer(roslz4_stream *str) {
  stream_state *state = str->state;
  if (str->input_left == 0 ||
      state->buffer_size == state->buffer_offset) {
    return 0;
  }
  int buffer_left = state->buffer_size - state->buffer_offset;
  int to_copy = min(str->input_left, buffer_left);

  int ret = XXH32_update(state->xxh32_state, str->input_next, to_copy);
  if (ret == XXH_ERROR) { return ROSLZ4_ERROR; }

  memcpy(state->buffer + state->buffer_offset, str->input_next, to_copy);
  advanceInput(str, to_copy);
  state->buffer_offset += to_copy;

  DEBUG("inputToBuffer() Wrote % 5i bytes to buffer (size=% 5i)\n",
        to_copy, state->buffer_offset);
  return to_copy;
}